

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_setup.cpp
# Opt level: O0

Box * the_nodes(Box *__return_storage_ptr__,Box *b)

{
  Box *b_local;
  int i;
  
  *(undefined8 *)(__return_storage_ptr__->smallend).vect = *(undefined8 *)(b->smallend).vect;
  *(undefined8 *)((__return_storage_ptr__->smallend).vect + 2) =
       *(undefined8 *)((b->smallend).vect + 2);
  *(undefined8 *)((__return_storage_ptr__->bigend).vect + 1) = *(undefined8 *)((b->bigend).vect + 1)
  ;
  (__return_storage_ptr__->btype).itype = (b->btype).itype;
  for (i = 0; i < 3; i = i + 1) {
    if (((__return_storage_ptr__->btype).itype & 1 << ((byte)i & 0x1f)) == 0) {
      (__return_storage_ptr__->bigend).vect[i] = (__return_storage_ptr__->bigend).vect[i] + 1;
    }
  }
  (__return_storage_ptr__->btype).itype = 7;
  return __return_storage_ptr__;
}

Assistant:

static Box the_nodes (const Box& b) { return amrex::surroundingNodes(b); }